

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O1

void tnt_schema_sval_free(tnt_schema_sval *val)

{
  mh_assoc_t *h;
  undefined8 *ptr;
  mh_int_t *pmVar1;
  void *key;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  uint x;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  assoc_val *ptr_00;
  assoc_val *local_50;
  
  if (val != (tnt_schema_sval *)0x0) {
    tnt_mem_free(val->name);
    h = val->index;
    if (h != (mh_assoc_t *)0x0) {
      uVar4 = h->n_buckets;
      if (uVar4 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        do {
          if ((h->b[uVar10 >> 4] >> ((uint)uVar10 & 0xf) & 1) != 0) goto LAB_00107bb5;
          uVar9 = (uint)uVar10 + 1;
          uVar10 = (ulong)uVar9;
        } while (uVar4 != uVar9);
        uVar10 = (ulong)uVar4;
      }
LAB_00107bb5:
      if ((uint)uVar10 < uVar4) {
        do {
          ptr = (undefined8 *)h->p[uVar10]->data;
          uVar2 = PMurHash32(0xd,(int *)((long)ptr + 0xc),4);
          uVar4 = h->n_buckets;
          uVar8 = (ulong)uVar2 % (ulong)uVar4;
          pmVar1 = h->b;
          while( true ) {
            uVar9 = (uint)uVar8;
            if (((((pmVar1[uVar8 >> 4] >> (uVar9 & 0xf) & 1) != 0) &&
                 ((h->p[uVar8]->key).id_len == 4)) &&
                (uVar6 = uVar9, *(int *)((long)ptr + 0xc) == *(int *)(h->p[uVar8]->key).id)) ||
               (uVar6 = uVar4, ((pmVar1[uVar8 >> 4] >> (sbyte)(uVar9 & 0xf)) >> 0x10 & 1) == 0))
            break;
            uVar9 = uVar9 + uVar2 % (uVar4 - 1) + 1;
            if (uVar9 < uVar4) {
              uVar6 = 0;
            }
            uVar8 = (ulong)(uVar9 - uVar6);
          }
          if (uVar6 == uVar4) {
            local_50 = (assoc_val *)0x0;
          }
          else {
            local_50 = h->p[uVar6];
            uVar4 = uVar6 >> 4;
            sVar5 = (sbyte)(uVar6 & 0xf);
            if ((pmVar1[uVar4] >> (uVar6 & 0xf) & 1) != 0) {
              pmVar1[uVar4] = pmVar1[uVar4] & ~(1 << sVar5);
              h->size = h->size - 1;
              if (((pmVar1[uVar4] >> sVar5) >> 0x10 & 1) == 0) {
                h->n_dirty = h->n_dirty - 1;
              }
              if (h->resize_position != 0) {
                mh_assoc_del_resize(h,uVar6,(void *)0x0);
              }
            }
          }
          key = (void *)*ptr;
          uVar4 = *(uint *)(ptr + 1);
          uVar2 = PMurHash32(0xd,key,uVar4);
          uVar9 = h->n_buckets;
          uVar8 = (ulong)uVar2 % (ulong)uVar9;
          pmVar1 = h->b;
          while( true ) {
            uVar7 = (uint)uVar8;
            uVar6 = pmVar1[uVar8 >> 4];
            if (((((uVar6 >> (uVar7 & 0xf) & 1) != 0) && (uVar4 == (h->p[uVar8]->key).id_len)) &&
                (iVar3 = bcmp(key,(h->p[uVar8]->key).id,(ulong)uVar4), x = uVar7, iVar3 == 0)) ||
               (x = uVar9, ((uVar6 >> (sbyte)(uVar7 & 0xf)) >> 0x10 & 1) == 0)) break;
            uVar7 = uVar7 + uVar2 % (uVar9 - 1) + 1;
            uVar6 = uVar9;
            if (uVar7 < uVar9) {
              uVar6 = 0;
            }
            uVar8 = (ulong)(uVar7 - uVar6);
          }
          if (x == uVar9) {
            ptr_00 = (assoc_val *)0x0;
          }
          else {
            ptr_00 = h->p[x];
            uVar4 = x >> 4;
            sVar5 = (sbyte)(x & 0xf);
            if ((pmVar1[uVar4] >> (x & 0xf) & 1) != 0) {
              pmVar1[uVar4] = pmVar1[uVar4] & ~(1 << sVar5);
              h->size = h->size - 1;
              if (((pmVar1[uVar4] >> sVar5) >> 0x10 & 1) == 0) {
                h->n_dirty = h->n_dirty - 1;
              }
              if (h->resize_position != 0) {
                mh_assoc_del_resize(h,x,(void *)0x0);
              }
            }
          }
          tnt_mem_free((void *)*ptr);
          tnt_mem_free(ptr);
          if (local_50 != (assoc_val *)0x0) {
            tnt_mem_free(local_50);
          }
          if (ptr_00 != (assoc_val *)0x0) {
            tnt_mem_free(ptr_00);
          }
          uVar4 = h->n_buckets;
          uVar9 = (uint)uVar10;
          if (uVar9 < uVar4) {
            do {
              uVar9 = uVar9 + 1;
              if (uVar4 == uVar9) {
                uVar10 = (ulong)uVar4;
                break;
              }
              uVar10 = (ulong)uVar9;
            } while ((h->b[uVar9 >> 4] >> (uVar9 & 0xf) & 1) == 0);
          }
        } while ((uint)uVar10 < uVar4);
      }
      mh_assoc_delete(val->index);
    }
  }
  tnt_mem_free(val);
  return;
}

Assistant:

static inline void
tnt_schema_sval_free(struct tnt_schema_sval *val) {
	if (val) {
		tnt_mem_free(val->name);
		if (val->index) {
			tnt_schema_index_free(val->index);
			mh_assoc_delete(val->index);
		}
	}
	tnt_mem_free(val);
}